

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

uint32_t __thiscall xatlas::internal::Mesh::findEdge(Mesh *this,uint32_t vertex0,uint32_t vertex1)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ColocalVertexIterator it1;
  ColocalVertexIterator it0;
  EdgeKey key;
  
  if ((this->m_nextColocalVertex).m_base.size == 0) {
    it0.m_mesh = (Mesh *)CONCAT44(vertex1,vertex0);
    uVar2 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
            ::get(&this->m_edgeMap,(EdgeKey *)&it0);
    uVar4 = 0xffffffff;
    for (; uVar2 != 0xffffffff;
        uVar2 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                ::getNext(&this->m_edgeMap,uVar2)) {
      bVar1 = isFaceIgnored(this,uVar2 / 3);
      if (!bVar1) {
        uVar4 = uVar2;
      }
    }
  }
  else {
    it0.m_first = 0xffffffff;
    uVar4 = 0xffffffff;
    it0.m_mesh = this;
    it0.m_current = vertex0;
    while (it0.m_first != it0.m_current) {
      it1.m_first = 0xffffffff;
      it1.m_mesh = this;
      it1.m_current = vertex1;
      while (it1.m_first != it1.m_current) {
        key.v0 = it0.m_current;
        key.v1 = it1.m_current;
        uVar2 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                ::get(&this->m_edgeMap,&key);
        while (uVar2 != 0xffffffff) {
          bVar1 = isFaceIgnored(this,uVar2 / 3);
          uVar3 = uVar4;
          if (((!bVar1) && (uVar3 = uVar2, this->m_id == 0xffffffff)) && (uVar4 != 0xffffffff)) {
            __assert_fail("m_id != (4294967295U) || (m_id == (4294967295U) && result == (4294967295U))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0xacf,
                          "uint32_t xatlas::internal::Mesh::findEdge(uint32_t, uint32_t) const");
          }
          uVar2 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                  ::getNext(&this->m_edgeMap,uVar2);
          uVar4 = uVar3;
        }
        ColocalVertexIterator::advance(&it1);
      }
      ColocalVertexIterator::advance(&it0);
    }
  }
  return uVar4;
}

Assistant:

uint32_t findEdge(uint32_t vertex0, uint32_t vertex1) const
	{
		uint32_t result = UINT32_MAX;
		if (m_nextColocalVertex.isEmpty()) {
			EdgeKey key(vertex0, vertex1);
			uint32_t edge = m_edgeMap.get(key);
			while (edge != UINT32_MAX) {
				// Don't find edges of ignored faces.
				if (!isFaceIgnored(meshEdgeFace(edge))) {
					//XA_DEBUG_ASSERT(m_id != UINT32_MAX || (m_id == UINT32_MAX && result == UINT32_MAX)); // duplicate edge - ignore on initial meshes
					result = edge;
#if !XA_DEBUG
					return result;
#endif
				}
				edge = m_edgeMap.getNext(edge);
			}
		} else {
			for (ColocalVertexIterator it0(this, vertex0); !it0.isDone(); it0.advance()) {
				for (ColocalVertexIterator it1(this, vertex1); !it1.isDone(); it1.advance()) {
					EdgeKey key(it0.vertex(), it1.vertex());
					uint32_t edge = m_edgeMap.get(key);
					while (edge != UINT32_MAX) {
						// Don't find edges of ignored faces.
						if (!isFaceIgnored(meshEdgeFace(edge))) {
							XA_DEBUG_ASSERT(m_id != UINT32_MAX || (m_id == UINT32_MAX && result == UINT32_MAX)); // duplicate edge - ignore on initial meshes
							result = edge;
#if !XA_DEBUG
							return result;
#endif
						}
						edge = m_edgeMap.getNext(edge);
					}
				}
			}
		}
		return result;
	}